

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  char **ppcVar2;
  char cVar3;
  int iVar4;
  vec<Minisat::Option_*,_int> *pvVar5;
  gzFile i;
  FILE *__s;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  size_t __size;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  vec<Minisat::Lit,_int> dummy;
  BoolOption strictp;
  IntOption mem_lim;
  IntOption cpu_lim;
  IntOption verb;
  Solver S;
  int local_540;
  int local_53c;
  vec<Minisat::Lit,_int> local_538;
  double local_520;
  double local_518;
  Lit local_50c;
  rusage local_508;
  gzFile local_478;
  char **local_470;
  Option local_468;
  char local_440;
  Option local_438;
  undefined8 local_410;
  int local_408;
  Option local_400;
  undefined8 local_3d8;
  uint local_3d0;
  Option local_3c8;
  undefined8 local_3a0;
  int local_398;
  Option *local_390;
  long local_388;
  int local_350;
  uint local_2a8;
  vec<Minisat::Lit,_int> local_238 [20];
  uint local_ec;
  
  local_540 = argc;
  Minisat::setUsageHelp
            (
            "USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n"
            );
  Minisat::setX86FPUPrecision();
  local_3c8._vptr_Option = (_func_int **)&PTR__Option_00105d28;
  local_3c8.name = "verb";
  local_3c8.description = "Verbosity level (0=silent, 1=some, 2=more).";
  local_3c8.category = "MAIN";
  local_3c8.type_name = "<int32>";
  pvVar5 = Minisat::Option::getOptionList();
  local_390 = &local_3c8;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar5,&local_390);
  local_3c8._vptr_Option = (_func_int **)&PTR__Option_00105cd0;
  local_3a0 = 0x200000000;
  local_398 = 1;
  local_400._vptr_Option = (_func_int **)&PTR__Option_00105d28;
  local_400.name = "cpu-lim";
  local_400.description = "Limit on CPU time allowed in seconds.\n";
  local_400.category = "MAIN";
  local_400.type_name = "<int32>";
  pvVar5 = Minisat::Option::getOptionList();
  local_390 = &local_400;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar5,&local_390);
  local_400._vptr_Option = (_func_int **)&PTR__Option_00105cd0;
  local_3d8 = 0x7fffffff00000000;
  local_3d0 = 0;
  local_438._vptr_Option = (_func_int **)&PTR__Option_00105d28;
  local_438.name = "mem-lim";
  local_438.description = "Limit on memory usage in megabytes.\n";
  local_438.category = "MAIN";
  local_438.type_name = "<int32>";
  pvVar5 = Minisat::Option::getOptionList();
  local_390 = &local_438;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar5,&local_390);
  local_438._vptr_Option = (_func_int **)&PTR__Option_00105cd0;
  local_410 = 0x7fffffff00000000;
  local_408 = 0;
  local_468._vptr_Option = (_func_int **)&PTR__Option_00105d28;
  local_468.name = "strict";
  local_468.description = "Validate DIMACS header during parsing.";
  local_468.category = "MAIN";
  local_468.type_name = "<bool>";
  pvVar5 = Minisat::Option::getOptionList();
  local_390 = &local_468;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar5,&local_390);
  local_468._vptr_Option = (_func_int **)&PTR__Option_00105d58;
  local_440 = '\0';
  Minisat::parseOptions(&local_540,argv,true);
  Minisat::Solver::Solver((Solver *)&local_390);
  getrusage(RUSAGE_SELF,&local_508);
  local_518 = (double)local_508.ru_utime.tv_sec;
  local_520 = (double)local_508.ru_utime.tv_usec;
  local_350 = local_398;
  solver = (Solver *)&local_390;
  Minisat::sigTerm(SIGINT_exit);
  if (local_3d0 != 0) {
    Minisat::limitTime(local_3d0);
  }
  if ((long)local_408 != 0) {
    Minisat::limitMemory((long)local_408);
  }
  if (local_540 == 1) {
    puts("Reading from standard input... Use \'--help\' for help.");
  }
  if (local_540 == 1) {
    i = (gzFile)gzdopen(0,"rb");
  }
  else {
    i = (gzFile)gzopen(argv[1],"rb");
  }
  if (i == (gzFile)0x0) {
    if (local_540 == 1) {
      pcVar7 = "<stdin>";
    }
    else {
      pcVar7 = argv[1];
    }
    printf("ERROR! Could not open file: %s\n",pcVar7);
    exit(1);
  }
  if (0 < local_350) {
    puts("============================[ Problem Statistics ]=============================");
    puts("|                                                                             |");
  }
  cVar3 = local_440;
  Minisat::StreamBuffer::StreamBuffer((StreamBuffer *)&local_508,i);
  local_520 = local_520 / 1000000.0 + local_518;
  local_538.data = (Lit *)0x0;
  local_538.sz = 0;
  local_538.cap = 0;
  iVar9 = 0;
  local_53c = 0;
  local_478 = i;
  local_470 = argv;
LAB_00102a0e:
  do {
    Minisat::skipWhitespace<Minisat::StreamBuffer>((StreamBuffer *)&local_508);
    if (local_508.ru_stime.tv_sec._4_4_ <= (int)local_508.ru_stime.tv_sec) {
      if ((cVar3 != '\0') && (iVar9 != local_53c)) {
        puts("PARSE ERROR! DIMACS header mismatch: wrong number of clauses");
      }
      ppcVar2 = local_470;
      if (local_538.data != (Lit *)0x0) {
        local_538._8_8_ = local_538._8_8_ & 0xffffffff00000000;
        free(local_538.data);
        local_538.data = (Lit *)0x0;
        local_538._8_8_ = local_538._8_8_ & 0xffffffff;
      }
      free((void *)local_508.ru_utime.tv_usec);
      gzclose();
      if (local_540 < 3) {
        __s = (FILE *)0x0;
      }
      else {
        __s = fopen(ppcVar2[2],"wb");
      }
      if (0 < local_350) {
        printf("|  Number of variables:  %12d                                         |\n",
               (ulong)local_ec);
        printf("|  Number of clauses:    %12d                                         |\n",
               (ulong)local_2a8);
      }
      getrusage(RUSAGE_SELF,&local_508);
      if (0 < local_350) {
        printf("|  Parse time:           %12.2f s                                       |\n",
               SUB84(((double)local_508.ru_utime.tv_sec +
                     (double)local_508.ru_utime.tv_usec / 1000000.0) - local_520,0));
        puts("|                                                                             |");
      }
      Minisat::sigTerm(SIGINT_interrupt);
      cVar3 = Minisat::Solver::simplify();
      if (cVar3 == '\0') {
        if (__s != (FILE *)0x0) {
          fwrite("UNSAT\n",6,1,__s);
          fclose(__s);
        }
        if (0 < local_350) {
          puts("===============================================================================");
          puts("Solved by unit propagation");
          Minisat::Solver::printStats();
          putchar(10);
        }
        puts("UNSATISFIABLE");
        exit(0x14);
      }
      local_508.ru_utime.tv_sec = 0;
      local_508.ru_utime.tv_usec = 0;
      Minisat::vec<Minisat::Lit,_int>::copyTo((vec<Minisat::Lit,_int> *)&local_508,local_238);
      cVar3 = Minisat::Solver::solve_();
      if (0 < local_350) {
        Minisat::Solver::printStats();
        putchar(10);
      }
      pcVar7 = "INDETERMINATE\n";
      if (cVar3 == '\x01') {
        pcVar7 = "UNSATISFIABLE\n";
      }
      pcVar8 = "SATISFIABLE\n";
      if (cVar3 != '\0') {
        pcVar8 = pcVar7;
      }
      printf(pcVar8);
      if (__s != (FILE *)0x0) {
        if (cVar3 == '\0') {
          fwrite("SAT\n",4,1,__s);
          if (0 < (int)local_ec) {
            lVar6 = 0;
            do {
              if ((*(byte *)(local_388 + lVar6) & 2) == 0) {
                pcVar7 = " ";
                if (lVar6 == 0) {
                  pcVar7 = "";
                }
                pcVar8 = "";
                if (*(byte *)(local_388 + lVar6) != 0) {
                  pcVar8 = "-";
                }
                fprintf(__s,"%s%s%d",pcVar7,pcVar8,(ulong)((int)lVar6 + 1));
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)local_ec);
          }
          pcVar7 = " 0\n";
          __size = 3;
        }
        else {
          if (cVar3 == '\x01') {
            pcVar7 = "UNSAT\n";
          }
          else {
            pcVar7 = "INDET\n";
          }
          __size = 6;
        }
        fwrite(pcVar7,__size,1,__s);
        fclose(__s);
      }
      if ((void *)local_508.ru_utime.tv_sec != (void *)0x0) {
        local_508.ru_utime.tv_usec = local_508.ru_utime.tv_usec & 0xffffffff00000000;
        free((void *)local_508.ru_utime.tv_sec);
        local_508.ru_utime.tv_sec = 0;
        local_508.ru_utime.tv_usec = local_508.ru_utime.tv_usec & 0xffffffff;
      }
      iVar9 = 0x14;
      if (cVar3 != '\x01') {
        iVar9 = 0;
      }
      iVar4 = 10;
      if (cVar3 != '\0') {
        iVar4 = iVar9;
      }
      Minisat::Solver::~Solver((Solver *)&local_390);
      return iVar4;
    }
    if (*(char *)(local_508.ru_utime.tv_usec + (int)local_508.ru_stime.tv_sec) == 'p') {
      lVar6 = 1;
      bVar12 = false;
      cVar1 = 'p';
      do {
        uVar11 = 0xffffffff;
        if ((int)local_508.ru_stime.tv_sec < local_508.ru_stime.tv_sec._4_4_) {
          uVar11 = (uint)*(byte *)(local_508.ru_utime.tv_usec + (int)local_508.ru_stime.tv_sec);
        }
        if (uVar11 != (int)cVar1) break;
        local_508.ru_stime.tv_sec._0_4_ = (int)local_508.ru_stime.tv_sec + 1;
        if (local_508.ru_stime.tv_sec._4_4_ <= (int)local_508.ru_stime.tv_sec) {
          local_508.ru_stime.tv_sec._0_4_ = 0;
          local_508.ru_stime.tv_sec._4_4_ =
               gzread(local_508.ru_utime.tv_sec,local_508.ru_utime.tv_usec,0x10000);
        }
        cVar1 = "p cnf"[lVar6];
        bVar12 = cVar1 == '\0';
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      if (!bVar12) {
        uVar10 = 0xffffffff;
        if ((int)local_508.ru_stime.tv_sec < local_508.ru_stime.tv_sec._4_4_) {
          uVar10 = (ulong)*(byte *)(local_508.ru_utime.tv_usec + (int)local_508.ru_stime.tv_sec);
        }
        printf("PARSE ERROR! Unexpected char: %c\n",uVar10);
        exit(3);
      }
      Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_508);
      local_53c = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_508);
      goto LAB_00102a0e;
    }
    if (*(char *)(local_508.ru_utime.tv_usec + (int)local_508.ru_stime.tv_sec) == 'c') {
      do {
        lVar6 = (long)(int)local_508.ru_stime.tv_sec;
        local_508.ru_stime.tv_sec._0_4_ = (int)local_508.ru_stime.tv_sec + 1;
        if (*(char *)(local_508.ru_utime.tv_usec + lVar6) == '\n') {
          if (local_508.ru_stime.tv_sec._4_4_ <= (int)local_508.ru_stime.tv_sec) {
            local_508.ru_stime.tv_sec._0_4_ = 0;
            local_508.ru_stime.tv_sec._4_4_ =
                 gzread(local_508.ru_utime.tv_sec,local_508.ru_utime.tv_usec,0x10000);
          }
          break;
        }
        if (local_508.ru_stime.tv_sec._4_4_ <= (int)local_508.ru_stime.tv_sec) {
          local_508.ru_stime.tv_sec._0_4_ = 0;
          local_508.ru_stime.tv_sec._4_4_ =
               gzread(local_508.ru_utime.tv_sec,local_508.ru_utime.tv_usec,0x10000);
        }
      } while ((int)local_508.ru_stime.tv_sec < local_508.ru_stime.tv_sec._4_4_);
    }
    else {
      if (local_538.data != (Lit *)0x0) {
        local_538._8_8_ = local_538._8_8_ & 0xffffffff00000000;
      }
      iVar4 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_508);
      local_518 = (double)CONCAT44(local_518._4_4_,iVar9);
      while (iVar4 != 0) {
        iVar9 = -iVar4;
        if (0 < iVar4) {
          iVar9 = iVar4;
        }
        while ((int)local_ec < iVar9) {
          Minisat::Solver::newVar((lbool)(uint8_t)(vec *)&local_390,true);
        }
        local_50c.x = ((iVar4 < 1) - 2) + iVar9 * 2;
        Minisat::vec<Minisat::Lit,_int>::push(&local_538,&local_50c);
        iVar4 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_508);
      }
      iVar9 = local_518._0_4_ + 1;
      Minisat::Solver::addClause_((vec *)&local_390);
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    try {
        setUsageHelp("USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n");
        setX86FPUPrecision();

        // Extra options:
        //
        IntOption    verb   ("MAIN", "verb",   "Verbosity level (0=silent, 1=some, 2=more).", 1, IntRange(0, 2));
        IntOption    cpu_lim("MAIN", "cpu-lim","Limit on CPU time allowed in seconds.\n", 0, IntRange(0, INT32_MAX));
        IntOption    mem_lim("MAIN", "mem-lim","Limit on memory usage in megabytes.\n", 0, IntRange(0, INT32_MAX));
        BoolOption   strictp("MAIN", "strict", "Validate DIMACS header during parsing.", false);
        
        parseOptions(argc, argv, true);

        Solver S;
        double initial_time = cpuTime();

        S.verbosity = verb;
        
        solver = &S;
        // Use signal handlers that forcibly quit until the solver will be able to respond to
        // interrupts:
        sigTerm(SIGINT_exit);

        // Try to set resource limits:
        if (cpu_lim != 0) limitTime(cpu_lim);
        if (mem_lim != 0) limitMemory(mem_lim);
        
        if (argc == 1)
            printf("Reading from standard input... Use '--help' for help.\n");
        
        gzFile in = (argc == 1) ? gzdopen(0, "rb") : gzopen(argv[1], "rb");
        if (in == NULL)
            printf("ERROR! Could not open file: %s\n", argc == 1 ? "<stdin>" : argv[1]), exit(1);
        
        if (S.verbosity > 0){
            printf("============================[ Problem Statistics ]=============================\n");
            printf("|                                                                             |\n"); }
        
        parse_DIMACS(in, S, (bool)strictp);
        gzclose(in);
        FILE* res = (argc >= 3) ? fopen(argv[2], "wb") : NULL;
        
        if (S.verbosity > 0){
            printf("|  Number of variables:  %12d                                         |\n", S.nVars());
            printf("|  Number of clauses:    %12d                                         |\n", S.nClauses()); }
        
        double parsed_time = cpuTime();
        if (S.verbosity > 0){
            printf("|  Parse time:           %12.2f s                                       |\n", parsed_time - initial_time);
            printf("|                                                                             |\n"); }
 
        // Change to signal-handlers that will only notify the solver and allow it to terminate
        // voluntarily:
        sigTerm(SIGINT_interrupt);
       
        if (!S.simplify()){
            if (res != NULL) fprintf(res, "UNSAT\n"), fclose(res);
            if (S.verbosity > 0){
                printf("===============================================================================\n");
                printf("Solved by unit propagation\n");
                S.printStats();
                printf("\n"); }
            printf("UNSATISFIABLE\n");
            exit(20);
        }
        
        vec<Lit> dummy;
        lbool ret = S.solveLimited(dummy);
        if (S.verbosity > 0){
            S.printStats();
            printf("\n"); }
        printf(ret == l_True ? "SATISFIABLE\n" : ret == l_False ? "UNSATISFIABLE\n" : "INDETERMINATE\n");
        if (res != NULL){
            if (ret == l_True){
                fprintf(res, "SAT\n");
                for (int i = 0; i < S.nVars(); i++)
                    if (S.model[i] != l_Undef)
                        fprintf(res, "%s%s%d", (i==0)?"":" ", (S.model[i]==l_True)?"":"-", i+1);
                fprintf(res, " 0\n");
            }else if (ret == l_False)
                fprintf(res, "UNSAT\n");
            else
                fprintf(res, "INDET\n");
            fclose(res);
        }
        
#ifdef NDEBUG
        exit(ret == l_True ? 10 : ret == l_False ? 20 : 0);     // (faster than "return", which will invoke the destructor for 'Solver')
#else
        return (ret == l_True ? 10 : ret == l_False ? 20 : 0);
#endif
    } catch (OutOfMemoryException&){
        printf("===============================================================================\n");
        printf("INDETERMINATE\n");
        exit(0);
    }
}